

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O1

int open_file(char *filename,coda_product **product_file,int force_binary)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 uVar9;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  coda_product *product;
  uchar buffer [80];
  coda_product *local_3a0;
  uint8_t local_398;
  char cStack_397;
  char cStack_396;
  byte bStack_395;
  uint8_t uStack_394;
  char cStack_393;
  char cStack_392;
  char cStack_391;
  uint8_t uStack_390;
  char cStack_38f;
  char cStack_38e;
  char cStack_38d;
  char cStack_38c;
  char cStack_38b;
  char cStack_38a;
  char cStack_389;
  char local_388;
  char cStack_385;
  char local_379;
  char local_371;
  coda_cursor local_340;
  
  if (filename == (char *)0x0) {
    __assert_fail("filename != NULL && file_size != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                  ,0x9d,"int get_file_size(const char *, int64_t *)");
  }
  iVar3 = stat(filename,(stat *)&local_340);
  if (iVar3 == 0) {
    if ((local_340.stack[0].index._1_1_ & 0x80) == 0) {
      pcVar7 = "could not open %s (not a regular file)";
      iVar3 = -0x15;
      goto LAB_00114877;
    }
    bVar11 = true;
  }
  else {
    piVar5 = __errno_location();
    if (*piVar5 == 2) {
      pcVar7 = "could not find %s";
      iVar3 = -0x14;
LAB_00114877:
      bVar11 = false;
      coda_set_error(iVar3,pcVar7,filename);
      local_340.stack[1].index = (long)pcVar7;
    }
    else {
      pcVar7 = strerror(*piVar5);
      pcVar8 = "could not open %s (%s)";
      bVar11 = false;
      coda_set_error(-0x15,"could not open %s (%s)",filename,pcVar7);
      local_340.stack[1].index = (long)pcVar8;
    }
  }
  iVar3 = -1;
  if (!bVar11) {
    return -1;
  }
  iVar4 = coda_bin_open(filename,local_340.stack[1].index,&local_3a0);
  if (iVar4 != 0) {
    return -1;
  }
  uVar9 = 1;
  if (force_binary == 0) {
    lVar1 = local_3a0->file_size;
    iVar4 = coda_cursor_set_product(&local_340,local_3a0);
    if (iVar4 == 0) {
      bVar11 = true;
      uVar9 = 1;
      if (3 < lVar1) {
        iVar4 = coda_cursor_read_bytes(&local_340,&local_398,0,4);
        if (iVar4 != 0) goto LAB_00114934;
        if (((cStack_396 == 'F' && CONCAT11(cStack_397,local_398) == 0x4443) && (bStack_395 < 6)) &&
           ((0x26U >> (bStack_395 & 0x1f) & 1) != 0)) {
          uVar9 = 6;
        }
        else if (CONCAT13(bStack_395,CONCAT12(cStack_396,CONCAT11(cStack_397,local_398))) ==
                 0x113030e) {
          uVar9 = 3;
        }
        else if (7 < lVar1) {
          iVar4 = coda_cursor_read_bytes(&local_340,&uStack_394,4,4);
          if (iVar4 != 0) goto LAB_00114934;
          lVar10 = CONCAT17(cStack_391,
                            CONCAT16(cStack_392,
                                     CONCAT15(cStack_393,
                                              CONCAT14(uStack_394,
                                                       CONCAT13(bStack_395,
                                                                CONCAT12(cStack_396,
                                                                         CONCAT11(cStack_397,
                                                                                  local_398)))))));
          if (lVar10 < 0x100cccc0100f3cd) {
            if ((lVar10 != -0xfffffeff0c33) && (lVar10 != -0xfffffd9f0d33)) {
              lVar6 = -0xffff00010000;
LAB_00114ab9:
              if (lVar10 != lVar6) {
                if ((CONCAT13(bStack_395,CONCAT12(cStack_396,CONCAT11(cStack_397,local_398))) ==
                     0x42495247) && ((byte)(cStack_391 - 1U) < 2)) {
                  uVar9 = 7;
                }
                else if ((uStack_394 == 'l' &&
                          CONCAT13(bStack_395,CONCAT12(cStack_396,CONCAT11(cStack_397,local_398)))
                          == 0x6d783f3c) ||
                        (CONCAT17(cStack_391,
                                  CONCAT16(cStack_392,
                                           CONCAT15(cStack_393,
                                                    CONCAT14(uStack_394,
                                                             CONCAT13(bStack_395,
                                                                      CONCAT12(cStack_396,
                                                                               CONCAT11(cStack_397,
                                                                                        local_398)))
                                                            )))) == 0x6c6d783f3cbfbbef)) {
                  uVar9 = 2;
                }
                else if (0x27 < lVar1) {
                  iVar4 = coda_cursor_read_bytes(&local_340,&uStack_390,8,0x20);
                  if (iVar4 == 0) {
                    if (((((((lVar1 < 0x3c) || (local_398 != '#')) ||
                           (2 < (byte)(cStack_397 + 0x9fU))) ||
                          ((cStack_396 != 'P' && cStack_396 != 'V' ||
                           (9 < (byte)(bStack_395 - 0x30))))) ||
                         ((9 < (byte)(uStack_394 - 0x30) ||
                          ((9 < (byte)(cStack_393 - 0x30U) || (9 < (byte)(cStack_392 - 0x30U)))))))
                        || (cStack_391 != ' ')) ||
                       ((((cStack_38e != ' ' || (cStack_38b != ' ')) || (local_388 != ' ')) ||
                        (((cStack_385 != ' ' || (local_379 != ' ')) || (local_371 != ' ')))))) {
                      if (0x4f < lVar1) {
                        iVar4 = coda_cursor_read_bytes(&local_340,&local_398,0x3c,0x14);
                        if (iVar4 != 0) goto LAB_00114934;
                        auVar13[0] = -((char)_local_388 == 'T');
                        auVar13[1] = -((char)((uint)_local_388 >> 8) == 'Y');
                        auVar13[2] = -((char)((uint)_local_388 >> 0x10) == 'P');
                        auVar13[3] = -((char)((uint)_local_388 >> 0x18) == 'E');
                        auVar13[4] = 0xff;
                        auVar13[5] = 0xff;
                        auVar13[6] = 0xff;
                        auVar13[7] = 0xff;
                        auVar13[8] = 0xff;
                        auVar13[9] = 0xff;
                        auVar13[10] = 0xff;
                        auVar13[0xb] = 0xff;
                        auVar13[0xc] = 0xff;
                        auVar13[0xd] = 0xff;
                        auVar13[0xe] = 0xff;
                        auVar13[0xf] = 0xff;
                        auVar12[0] = -(local_398 == 'R');
                        auVar12[1] = -(cStack_397 == 'I');
                        auVar12[2] = -(cStack_396 == 'N');
                        auVar12[3] = -(bStack_395 == 0x45);
                        auVar12[4] = -(uStack_394 == 'X');
                        auVar12[5] = -(cStack_393 == ' ');
                        auVar12[6] = -(cStack_392 == 'V');
                        auVar12[7] = -(cStack_391 == 'E');
                        auVar12[8] = -(uStack_390 == 'R');
                        auVar12[9] = -(cStack_38f == 'S');
                        auVar12[10] = -(cStack_38e == 'I');
                        auVar12[0xb] = -(cStack_38d == 'O');
                        auVar12[0xc] = -(cStack_38c == 'N');
                        auVar12[0xd] = -(cStack_38b == ' ');
                        auVar12[0xe] = -(cStack_38a == '/');
                        auVar12[0xf] = -(cStack_389 == ' ');
                        auVar12 = auVar12 & auVar13;
                        if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
                          uVar9 = 8;
                        }
                        else if (0x208 < lVar1) {
                          lVar10 = 0x200;
                          do {
                            iVar4 = coda_cursor_read_bytes(&local_340,&local_398,lVar10,8);
                            bVar11 = iVar4 == 0;
                            if (!bVar11) break;
                            bVar2 = bVar11;
                            if (CONCAT17(cStack_391,
                                         CONCAT16(cStack_392,
                                                  CONCAT15(cStack_393,
                                                           CONCAT14(uStack_394,
                                                                    CONCAT13(bStack_395,
                                                                             CONCAT12(cStack_396,
                                                                                      CONCAT11(
                                                  cStack_397,local_398))))))) == 0xa1a0a0d46444889)
                            goto LAB_00114c9b;
                            lVar6 = lVar10 * 2;
                            lVar10 = lVar10 * 2;
                          } while (lVar6 + 8 < lVar1);
                        }
                      }
                    }
                    else {
                      uVar9 = 9;
                    }
                  }
                  else {
LAB_00114934:
                    bVar11 = false;
                  }
                }
                goto LAB_00114937;
              }
            }
          }
          else if (lVar10 != 0x100cccc0100f3cd) {
            bVar2 = true;
            if (lVar10 == 0xa1a0a0d46444889) {
LAB_00114c9b:
              bVar11 = bVar2;
              uVar9 = 4;
              goto LAB_00114937;
            }
            lVar6 = 0x100cccc0260f2cd;
            goto LAB_00114ab9;
          }
          uVar9 = 5;
        }
      }
    }
    else {
      bVar11 = false;
      uVar9 = 1;
    }
LAB_00114937:
    if (!bVar11) goto LAB_0011499e;
  }
  switch(uVar9) {
  case 0:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                  ,0x165,"int reopen_with_backend(coda_product **, coda_format)");
  default:
    goto switchD_00114957_caseD_1;
  case 2:
    iVar4 = coda_xml_reopen(&local_3a0);
    break;
  case 3:
    iVar3 = -0xb;
    goto LAB_00114995;
  case 4:
    iVar3 = -0xd;
LAB_00114995:
    coda_set_error(iVar3,(char *)0x0);
LAB_0011499e:
    coda_close(local_3a0);
    return -1;
  case 5:
    iVar4 = coda_cdf_reopen(&local_3a0);
    break;
  case 6:
    iVar4 = coda_netcdf_reopen(&local_3a0);
    break;
  case 7:
    iVar4 = coda_grib_reopen(&local_3a0);
    break;
  case 8:
    iVar4 = coda_rinex_reopen(&local_3a0);
    break;
  case 9:
    iVar4 = coda_sp3_reopen(&local_3a0);
  }
  if (iVar4 == 0) {
switchD_00114957_caseD_1:
    *product_file = local_3a0;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int get_file_size(const char *filename, int64_t *file_size)
{
    struct stat statbuf;

    assert(filename != NULL && file_size != NULL);

    /* stat() the file to be opened */

    if (stat(filename, &statbuf) != 0)
    {
        if (errno == ENOENT)
        {
            coda_set_error(CODA_ERROR_FILE_NOT_FOUND, "could not find %s", filename);
        }
        else
        {
            coda_set_error(CODA_ERROR_FILE_OPEN, "could not open %s (%s)", filename, strerror(errno));
        }
        return -1;
    }

    /* check that the file is a regular file */

    if ((statbuf.st_mode & S_IFREG) == 0)
    {
        coda_set_error(CODA_ERROR_FILE_OPEN, "could not open %s (not a regular file)", filename);
        return -1;
    }

    /* get file size */

    *file_size = statbuf.st_size;

    return 0;
}